

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O3

int lj_ccall_func(lua_State *L,GCcdata *cd)

{
  CTSize *pCVar1;
  long *plVar2;
  ushort uVar3;
  uint uVar4;
  CTSize CVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  void *pvVar9;
  ulong uVar10;
  TValue *pTVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  byte bVar16;
  cTValue *pcVar17;
  CType *pCVar18;
  cTValue *pcVar19;
  ulong uVar20;
  int iVar21;
  CTState *cts;
  uint *puVar22;
  uint uVar23;
  uint uVar24;
  CType *pCVar25;
  MSize nfpr;
  CType *pCVar26;
  int rcl [2];
  CCallState cc;
  ulong local_240;
  uint local_230 [2];
  cTValue local_228;
  cTValue acStack_220 [2];
  cTValue *local_210;
  TValue *local_208;
  ulong local_200;
  GCcdata local_1f8;
  uint local_1f0;
  byte local_1ec;
  char local_1eb;
  byte local_1ea;
  byte local_1e9;
  cTValue local_1e8 [16];
  cTValue local_168 [6];
  cTValue local_138 [33];
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  pCVar18 = cts->tab;
  uVar12 = pCVar18[cd->ctypeid].info & 0xf0000000;
  pCVar26 = pCVar18 + cd->ctypeid;
  if (uVar12 == 0x20000000) {
    pCVar1 = &pCVar26->size;
    uVar10 = (ulong)((pCVar18[cd->ctypeid].info & 0xffff) << 4);
    if ((*(uint *)((long)&pCVar18->info + uVar10) & 0xf0000000) != 0x60000000) {
      return -1;
    }
    pCVar26 = (CType *)((long)&pCVar18->info + uVar10);
    if (*pCVar1 != 4) goto LAB_001363e7;
    local_1f8.marked = '\0';
    local_1f8.gct = '\0';
    local_1f8.ctypeid = 0;
    local_1f8.nextgc.gcptr32 = cd[1].nextgc.gcptr32;
  }
  else {
    if (uVar12 != 0x60000000) {
      return -1;
    }
LAB_001363e7:
    local_1f8 = cd[1];
  }
  local_208 = L->top;
  memset(local_1e8,0,0xb0);
  uVar3 = (ushort)pCVar26->info;
  uVar12 = pCVar18[uVar3].info;
  pCVar18 = pCVar18 + uVar3;
  if ((uVar12 & 0xf8000000) == 0x38000000) {
    local_240 = 0;
    if ((pCVar18->size != 8) && (pCVar18->size != 0x10)) {
LAB_00136466:
      lj_err_caller(L,LJ_ERR_FFI_NYICALL);
    }
  }
  else {
    local_240 = 0;
    if ((uVar12 & 0xf4000000) == 0x34000000 || (uVar12 & 0xf0000000) == 0x10000000) {
      pvVar9 = lj_mem_newgco(L,pCVar18->size + 8);
      *(undefined1 *)((long)pvVar9 + 5) = 10;
      *(ushort *)((long)pvVar9 + 6) = uVar3;
      plVar2 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
      *plVar2 = *plVar2 + 1;
      pTVar11 = L->top;
      L->top = pTVar11 + 1;
      (pTVar11->u32).lo = (uint32_t)pvVar9;
      (pTVar11->field_2).it = 0xfffffff5;
      if ((pCVar18->info & 0xf0000000) == 0x10000000) {
        local_228.u64 = 0;
        iVar21 = ccall_classify_struct(cts,pCVar18,(int *)&local_228.u64,0);
        local_1eb = iVar21 != 0;
        if ((bool)local_1eb) {
          local_168[0].u64 = (long)pvVar9 + 8;
        }
        local_240 = (ulong)(byte)local_1eb;
      }
      else {
        local_1eb = '\0';
      }
    }
  }
  local_210 = local_168;
  uVar10 = (ulong)pCVar26->sib;
  uVar8 = (uint)pCVar26->sib;
  pcVar19 = L->base + 1;
  uVar12 = 0;
  if (pcVar19 < local_208) {
    iVar21 = 1;
    uVar13 = 0;
    uVar12 = 0;
    do {
      if ((int)uVar10 == 0) {
        if ((pCVar26->info & 0x800000) == 0) goto LAB_00136c4d;
        uVar8 = lj_ccall_ctid_vararg(cts,pcVar19);
        pCVar18 = cts->tab;
        uVar20 = 0;
      }
      else {
        pCVar18 = cts->tab;
        uVar20 = (ulong)pCVar18[uVar10 & 0xffffffff].sib;
        uVar8 = (uint)(ushort)pCVar18[uVar10 & 0xffffffff].info;
      }
      uVar4 = pCVar18[uVar8].info;
      pCVar18 = pCVar18 + uVar8;
      uVar8 = pCVar18->size;
      local_200 = uVar20;
      if (uVar4 < 0x10000000) {
        if (8 < uVar8) goto LAB_00136466;
        uVar23 = uVar8 + 7 >> 3;
        uVar24 = uVar23;
        if ((uVar4 >> 0x1a & 1) == 0) goto LAB_00136771;
        bVar16 = 0;
LAB_00136751:
        if (uVar23 + uVar12 < 9) {
          pcVar17 = local_1e8 + (ulong)uVar12 * 2;
          uVar12 = uVar23 + uVar12;
        }
        else {
LAB_0013679b:
          if (0x30000 < (pCVar18->info & 0xf0000)) {
            uVar8 = -1 << ((byte)(pCVar18->info + 0xd0000 >> 0x10) & 0xf);
            uVar13 = uVar13 + ~uVar8 & uVar8;
          }
          if (0x20 < uVar13 + uVar24) goto LAB_00136466;
          pcVar17 = local_138 + uVar13;
          uVar13 = uVar13 + uVar24;
        }
LAB_001367f8:
        lj_cconv_ct_tv(cts,pCVar18,(uint8_t *)&pcVar17->u64,pcVar19,iVar21 << 8);
        if (((pCVar18->info & 0xf4000000) == 0) && (uVar8 = pCVar18->size, uVar8 < 4)) {
          if ((pCVar18->info >> 0x17 & 1) == 0) {
            if (uVar8 == 1) {
              uVar8 = (uint)(char)*(byte *)pcVar17;
            }
            else {
              uVar8 = (uint)(short)*(ushort *)pcVar17;
            }
          }
          else if (uVar8 == 1) {
            uVar8 = (uint)*(byte *)pcVar17;
          }
          else {
            uVar8 = (uint)*(ushort *)pcVar17;
          }
          *(uint *)pcVar17 = uVar8;
        }
        uVar10 = local_200;
        if (((bool)(bVar16 & uVar24 == 2)) && (pcVar17 == local_1e8 + (ulong)(uVar12 - 2) * 2)) {
          local_1e8[(ulong)(uVar12 - 1) * 2] = pcVar17[1];
          pcVar17[1].u64 = 0;
        }
      }
      else {
        if ((uVar4 & 0xf8000000) == 0x38000000) {
          if ((uVar8 == 8) || (uVar8 == 0x10)) {
            uVar23 = 1;
            bVar16 = 0;
            uVar24 = uVar8 + 7 >> 3;
            goto LAB_00136751;
          }
          goto LAB_00136466;
        }
        if ((uVar4 & 0xf0000000) != 0x10000000) {
          uVar24 = 1;
          if ((uVar4 & 0xf4000000) == 0x34000000) {
            uVar23 = uVar8 + 7 >> 3;
            bVar16 = 1;
            uVar24 = uVar23;
            goto LAB_00136751;
          }
LAB_00136771:
          uVar8 = (int)local_240 + uVar24;
          if (6 < uVar8) {
            bVar16 = 0;
            goto LAB_0013679b;
          }
          pcVar17 = local_168 + local_240;
          bVar16 = 0;
          local_240 = (ulong)uVar8;
          goto LAB_001367f8;
        }
        local_230[0] = 0;
        local_230[1] = 0;
        iVar7 = ccall_classify_struct(cts,pCVar18,(int *)local_230,0);
        if (iVar7 != 0) {
          uVar24 = uVar8 + 7 >> 3;
          if (uVar8 + 7 < 0x18) goto LAB_00136771;
          bVar16 = 0;
          goto LAB_0013679b;
        }
        local_1ec = (byte)uVar13;
        local_1ea = (byte)local_240;
        local_1e9 = (byte)uVar12;
        local_228.u64 = 0;
        acStack_220[0].u64 = 0;
        lj_cconv_ct_tv(cts,pCVar18,(uint8_t *)&local_228.u64,pcVar19,iVar21 << 8);
        uVar14 = (ulong)local_1e9;
        uVar10 = (ulong)local_1ea;
        pcVar17 = &local_228;
        puVar22 = local_230;
        bVar6 = true;
        do {
          bVar15 = bVar6;
          if ((*puVar22 & 1) == 0) {
            local_240 = uVar10;
            if ((*puVar22 & 2) != 0) {
              if (7 < (uint)uVar14) goto LAB_001369b4;
              local_1e8[uVar14 * 2].u64 = *(uint64_t *)pcVar17;
              uVar14 = (ulong)((uint)uVar14 + 1);
            }
          }
          else {
            if (5 < (uint)uVar10) {
LAB_001369b4:
              uVar10 = (ulong)local_1ec;
              iVar7 = 2 - (uint)(local_230[1] == 0);
              uVar12 = iVar7 + (uint)local_1ec;
              if (0x20 < uVar12) goto LAB_00136466;
              local_1ec = (byte)uVar12;
              memcpy(local_138 + uVar10,&local_228,(ulong)(uint)(iVar7 * 8));
              local_240 = (ulong)local_1ea;
              uVar14 = (ulong)local_1e9;
              goto LAB_001369f7;
            }
            local_240 = (ulong)((uint)uVar10 + 1);
            local_168[uVar10].u64 = *(uint64_t *)pcVar17;
          }
          uVar10 = local_240;
          pcVar17 = acStack_220;
          puVar22 = local_230 + 1;
          bVar6 = false;
        } while (bVar15);
        local_1ea = (byte)local_240;
        local_1e9 = (byte)uVar14;
LAB_001369f7:
        uVar13 = (uint)local_1ec;
        local_240 = local_240 & 0xff;
        uVar12 = (uint)(byte)uVar14;
        uVar10 = uVar20;
      }
      uVar8 = (uint)uVar10;
      iVar21 = iVar21 + 1;
      pcVar19 = pcVar19 + 1;
    } while (pcVar19 < local_208);
  }
  else {
    uVar13 = 0;
  }
  if (uVar8 != 0) {
LAB_00136c4d:
    lj_err_caller(L,LJ_ERR_FFI_NUMARG);
  }
  local_1e9 = (byte)uVar12;
  local_1ec = (byte)uVar13;
  local_1f0 = 8;
  if (1 < uVar13) {
    local_1f0 = uVar13 * 8 | 8;
  }
  pCVar18 = cts->tab;
  (cts->cb).slot = 0xffffffff;
  lj_vm_ffi_call();
  if ((cts->cb).slot != 0xffffffff) {
    local_228.u64 = (ulong)local_1f8 >> 2;
    pTVar11 = lj_tab_set(L,cts->miscmap,&local_228);
    (pTVar11->field_2).it = 0xfffffffd;
  }
  pCVar25 = cts->tab;
  uVar3 = *(ushort *)((long)pCVar26 + ((long)pCVar25 - (long)pCVar18));
  uVar12 = pCVar25[uVar3].info;
  if ((uVar12 & 0xf0000000) == 0x40000000) {
    return 0;
  }
  pCVar25 = pCVar25 + uVar3;
  if ((uVar12 & 0xf0000000) == 0x10000000) {
    iVar21 = 1;
    if (local_1eb == '\0') {
      uVar12 = L->top[-1].u32.lo;
      local_230[0] = 0;
      local_230[1] = 0;
      uVar10 = 0;
      ccall_classify_struct(cts,pCVar25,(int *)local_230,0);
      uVar8 = pCVar25->size;
      uVar13 = 0;
      pcVar19 = &local_228;
      puVar22 = local_230;
      bVar6 = true;
      do {
        bVar15 = bVar6;
        if ((*puVar22 & 1) == 0) {
          if ((*puVar22 & 2) != 0) {
            pcVar17 = local_1e8 + uVar10 * 2;
            uVar10 = (ulong)((int)uVar10 + 1);
            goto LAB_00136b61;
          }
        }
        else {
          uVar20 = (ulong)uVar13;
          uVar13 = uVar13 + 1;
          pcVar17 = local_168 + uVar20;
LAB_00136b61:
          *pcVar19 = *pcVar17;
        }
        pcVar19 = acStack_220;
        puVar22 = local_230 + 1;
        bVar6 = false;
      } while (bVar15);
      memcpy((void *)((ulong)uVar12 + 8),&local_228,(ulong)uVar8);
    }
    goto LAB_00136c15;
  }
  if ((uVar12 & 0xf4000000) == 0x4000000) {
LAB_00136beb:
    local_210 = local_1e8;
  }
  else {
    if ((uVar12 & 0xf4000000) == 0x34000000) {
      CVar5 = pCVar25->size;
      uVar10 = (ulong)L->top[-1].u32.lo;
      *(cTValue *)(uVar10 + 8) = local_1e8[0];
      iVar21 = 1;
      if (CVar5 != 8) {
        *(cTValue *)(uVar10 + 0x10) = local_1e8[2];
      }
      goto LAB_00136c15;
    }
    if ((uVar12 & 0xf8000000) == 0x38000000) goto LAB_00136beb;
  }
  iVar21 = lj_cconv_tv_ct(cts,pCVar25,0,L->top + -1,(uint8_t *)&local_210->u64);
  if (iVar21 < 1) {
    return 1;
  }
LAB_00136c15:
  uVar12 = iVar21 + 1;
  do {
    uVar10 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar10 + 0x54) <= *(uint *)(uVar10 + 0x50)) {
      lj_gc_step(L);
    }
    uVar12 = uVar12 - 1;
  } while (1 < uVar12);
  return 1;
}

Assistant:

int lj_ccall_func(lua_State *L, GCcdata *cd)
{
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTSize sz = CTSIZE_PTR;
  if (ctype_isptr(ct->info)) {
    sz = ct->size;
    ct = ctype_rawchild(cts, ct);
  }
  if (ctype_isfunc(ct->info)) {
    CCallState cc;
    int gcsteps, ret;
    cc.func = (void (*)(void))cdata_getptr(cdataptr(cd), sz);
    gcsteps = ccall_set_args(L, cts, ct, &cc);
    ct = (CType *)((intptr_t)ct-(intptr_t)cts->tab);
    cts->cb.slot = ~0u;
    lj_vm_ffi_call(&cc);
    if (cts->cb.slot != ~0u) {  /* Blacklist function that called a callback. */
      TValue tv;
      tv.u64 = ((uintptr_t)(void *)cc.func >> 2) | U64x(800000000, 00000000);
      setboolV(lj_tab_set(L, cts->miscmap, &tv), 1);
    }
    ct = (CType *)((intptr_t)ct+(intptr_t)cts->tab);  /* May be reallocated. */
    gcsteps += ccall_get_results(L, cts, ct, &cc, &ret);
#if LJ_TARGET_X86 && LJ_ABI_WIN
    /* Automatically detect __stdcall and fix up C function declaration. */
    if (cc.spadj && ctype_cconv(ct->info) == CTCC_CDECL) {
      CTF_INSERT(ct->info, CCONV, CTCC_STDCALL);
      lj_trace_abort(G(L));
    }
#endif
    while (gcsteps-- > 0)
      lj_gc_check(L);
    return ret;
  }
  return -1;  /* Not a function. */
}